

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int nextScaffoldPart(XML_Parser parser)

{
  long lVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  if (*(long *)((long)parser + 0x3c0) == 0) {
    puVar3 = (undefined4 *)
             (**(code **)((long)parser + 0x18))((ulong)*(uint *)((long)parser + 0x480) << 2);
    *(undefined4 **)((long)parser + 0x3c0) = puVar3;
    if (puVar3 != (undefined4 *)0x0) {
      *puVar3 = 0;
      goto LAB_004c8aed;
    }
LAB_004c8b9f:
    uVar5 = 0xffffffff;
  }
  else {
LAB_004c8aed:
    uVar5 = *(uint *)((long)parser + 0x3b8);
    lVar4 = *(long *)((long)parser + 0x3a8);
    if (*(uint *)((long)parser + 0x3b4) <= uVar5) {
      if (lVar4 == 0) {
        *(undefined4 *)((long)parser + 0x3b4) = 0x20;
        lVar4 = (**(code **)((long)parser + 0x18))(0x400);
      }
      else {
        uVar5 = *(uint *)((long)parser + 0x3b4) * 2;
        *(uint *)((long)parser + 0x3b4) = uVar5;
        lVar4 = (**(code **)((long)parser + 0x20))(lVar4,(ulong)uVar5 << 5);
      }
      *(long *)((long)parser + 0x3a8) = lVar4;
      if (lVar4 == 0) goto LAB_004c8b9f;
      uVar5 = *(uint *)((long)parser + 0x3b8);
    }
    *(uint *)((long)parser + 0x3b8) = uVar5 + 1;
    if ((long)*(int *)((long)parser + 0x3bc) != 0) {
      lVar6 = (long)*(int *)(*(long *)((long)parser + 0x3c0) + -4 +
                            (long)*(int *)((long)parser + 0x3bc) * 4) * 0x20;
      lVar1 = lVar4 + lVar6;
      lVar6 = (long)*(int *)(lVar4 + 0x14 + lVar6);
      if (lVar6 != 0) {
        *(uint *)(lVar4 + 0x1c + lVar6 * 0x20) = uVar5;
      }
      if (*(int *)(lVar1 + 0x18) == 0) {
        *(uint *)(lVar1 + 0x10) = uVar5;
      }
      *(uint *)(lVar1 + 0x14) = uVar5;
      *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) + 1;
    }
    puVar2 = (undefined8 *)(lVar4 + 0x10 + (long)(int)uVar5 * 0x20);
    *puVar2 = 0;
    puVar2[1] = 0;
  }
  return uVar5;
}

Assistant:

static int
nextScaffoldPart(XML_Parser parser)
{
  CONTENT_SCAFFOLD * me;
  int next;

  if (! dtd.scaffIndex) {
    dtd.scaffIndex = MALLOC(groupSize * sizeof(int));
    if (! dtd.scaffIndex)
      return -1;
    dtd.scaffIndex[0] = 0;
  }

  if (dtd.scaffCount >= dtd.scaffSize) {
    if (dtd.scaffold) {
      dtd.scaffSize *= 2;
      dtd.scaffold = (CONTENT_SCAFFOLD *) REALLOC(dtd.scaffold,
                                              dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    else {
      dtd.scaffSize = 32;
      dtd.scaffold = (CONTENT_SCAFFOLD *) MALLOC(dtd.scaffSize * sizeof(CONTENT_SCAFFOLD));
    }
    if (! dtd.scaffold)
      return -1;
  }
  next = dtd.scaffCount++;
  me = &dtd.scaffold[next];
  if (dtd.scaffLevel) { 
    CONTENT_SCAFFOLD *parent = &dtd.scaffold[dtd.scaffIndex[dtd.scaffLevel - 1]];
    if (parent->lastchild) {
      dtd.scaffold[parent->lastchild].nextsib = next;
    }
    if (! parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}